

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walLockShared(Wal *pWal,int lockIdx)

{
  int iVar1;
  
  if (pWal->exclusiveMode != '\0') {
    return 0;
  }
  iVar1 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,lockIdx,1,6);
  return iVar1;
}

Assistant:

static int walLockShared(Wal *pWal, int lockIdx){
  int rc;
  if( pWal->exclusiveMode ) return SQLITE_OK;
  rc = sqlite3OsShmLock(pWal->pDbFd, lockIdx, 1,
                        SQLITE_SHM_LOCK | SQLITE_SHM_SHARED);
  WALTRACE(("WAL%p: acquire SHARED-%s %s\n", pWal,
            walLockName(lockIdx), rc ? "failed" : "ok"));
  VVA_ONLY( pWal->lockError = (u8)(rc!=SQLITE_OK && rc!=SQLITE_BUSY); )
  return rc;
}